

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argtable3.c
# Opt level: O0

int parse_long_options(char **nargv,char *options,option *long_options,int *idx,int short_too,
                      int flags)

{
  bool bVar1;
  bool bVar2;
  char *__s;
  int iVar3;
  char *pcVar4;
  size_t sVar5;
  int second_partial_match;
  int exact_match;
  int match;
  int i;
  size_t current_argv_len;
  char *current_dash;
  char *has_equal;
  char *current_argv;
  int flags_local;
  int short_too_local;
  int *idx_local;
  option *long_options_local;
  char *options_local;
  char **nargv_local;
  
  __s = place;
  if (dash_prefix == 0) {
    current_argv_len = (long)"--" + 1;
  }
  else if (dash_prefix == 1) {
    current_argv_len = (size_t)anon_var_dwarf_4c5;
  }
  else if (dash_prefix == 2) {
    current_argv_len = (size_t)anon_var_dwarf_4d0;
  }
  else {
    current_argv_len = (long)"Convert text to P4 portable bitmap.\n\n" + 0x25;
  }
  second_partial_match = -1;
  bVar1 = false;
  bVar2 = false;
  optind = optind + 1;
  pcVar4 = strchr(place,0x3d);
  if (pcVar4 == (char *)0x0) {
    _match = strlen(__s);
    current_dash = (char *)0x0;
  }
  else {
    _match = (long)pcVar4 - (long)__s;
    current_dash = pcVar4 + 1;
  }
  exact_match = 0;
  do {
    if (long_options[exact_match].name == (char *)0x0) {
LAB_0010dfd9:
      if ((bVar1) || (!bVar2)) {
        if (second_partial_match == -1) {
          if (short_too == 0) {
            if ((opterr != 0) && (*options != ':')) {
              warnx("unrecognized option `%s%s\'",current_argv_len,__s);
            }
            optopt = 0;
            nargv_local._4_4_ = 0x3f;
          }
          else {
            optind = optind + -1;
            nargv_local._4_4_ = -1;
          }
        }
        else if ((long_options[second_partial_match].has_arg == 0) && (current_dash != (char *)0x0))
        {
          if ((opterr != 0) && (*options != ':')) {
            warnx("option `%s%.*s\' doesn\'t allow an argument",current_argv_len,_match & 0xffffffff
                  ,__s);
          }
          if (long_options[second_partial_match].flag == (int *)0x0) {
            optopt = long_options[second_partial_match].val;
          }
          else {
            optopt = 0;
          }
          nargv_local._4_4_ = 0x3f;
        }
        else {
          if ((long_options[second_partial_match].has_arg == 1) ||
             (long_options[second_partial_match].has_arg == 2)) {
            if (current_dash == (char *)0x0) {
              if (long_options[second_partial_match].has_arg == 1) {
                optarg = nargv[optind];
                optind = optind + 1;
              }
            }
            else {
              optarg = current_dash;
            }
          }
          if ((long_options[second_partial_match].has_arg == 1) && (optarg == (char *)0x0)) {
            if ((opterr != 0) && (*options != ':')) {
              warnx("option `%s%s\' requires an argument",current_argv_len,__s);
            }
            if (long_options[second_partial_match].flag == (int *)0x0) {
              optopt = long_options[second_partial_match].val;
            }
            else {
              optopt = 0;
            }
            optind = optind + -1;
            nargv_local._4_4_ = 0x3f;
            if (*options == ':') {
              nargv_local._4_4_ = 0x3a;
            }
          }
          else {
            if (idx != (int *)0x0) {
              *idx = second_partial_match;
            }
            if (long_options[second_partial_match].flag == (int *)0x0) {
              nargv_local._4_4_ = long_options[second_partial_match].val;
            }
            else {
              *long_options[second_partial_match].flag = long_options[second_partial_match].val;
              nargv_local._4_4_ = 0;
            }
          }
        }
      }
      else {
        if ((opterr != 0) && (*options != ':')) {
          warnx("option `%s%.*s\' is ambiguous",current_argv_len,_match & 0xffffffff,__s);
        }
        optopt = 0;
        nargv_local._4_4_ = 0x3f;
      }
      return nargv_local._4_4_;
    }
    iVar3 = strncmp(__s,long_options[exact_match].name,_match);
    if (iVar3 == 0) {
      sVar5 = strlen(long_options[exact_match].name);
      if (sVar5 == _match) {
        second_partial_match = exact_match;
        bVar1 = true;
        goto LAB_0010dfd9;
      }
      if ((short_too == 0) || (_match != 1)) {
        if (second_partial_match == -1) {
          second_partial_match = exact_match;
        }
        else if (((((flags & 4U) != 0) ||
                  (long_options[exact_match].has_arg != long_options[second_partial_match].has_arg))
                 || (long_options[exact_match].flag != long_options[second_partial_match].flag)) ||
                (long_options[exact_match].val != long_options[second_partial_match].val)) {
          bVar2 = true;
        }
      }
    }
    exact_match = exact_match + 1;
  } while( true );
}

Assistant:

static int
parse_long_options(char * const *nargv, const char *options,
	const struct option *long_options, int *idx, int short_too, int flags)
{
	char *current_argv, *has_equal;
#ifdef GNU_COMPATIBLE
	char *current_dash;
#endif
	size_t current_argv_len;
	int i, match, exact_match, second_partial_match;

	current_argv = place;
#ifdef GNU_COMPATIBLE
	switch (dash_prefix) {
		case D_PREFIX:
			current_dash = "-";
			break;
		case DD_PREFIX:
			current_dash = "--";
			break;
		case W_PREFIX:
			current_dash = "-W ";
			break;
		default:
			current_dash = "";
			break;
	}
#endif
	match = -1;
	exact_match = 0;
	second_partial_match = 0;

	optind++;

	if ((has_equal = strchr(current_argv, '=')) != NULL) {
		/* argument found (--option=arg) */
		current_argv_len = (size_t)(has_equal - current_argv);
		has_equal++;
	} else
		current_argv_len = strlen(current_argv);

	for (i = 0; long_options[i].name; i++) {
		/* find matching long option */
		if (strncmp(current_argv, long_options[i].name,
		    current_argv_len))
			continue;

		if (strlen(long_options[i].name) == current_argv_len) {
			/* exact match */
			match = i;
			exact_match = 1;
			break;
		}
		/*
		 * If this is a known short option, don't allow
		 * a partial match of a single character.
		 */
		if (short_too && current_argv_len == 1)
			continue;

		if (match == -1)	/* first partial match */
			match = i;
		else if ((flags & FLAG_LONGONLY) ||
			 long_options[i].has_arg !=
			     long_options[match].has_arg ||
			 long_options[i].flag != long_options[match].flag ||
			 long_options[i].val != long_options[match].val)
			second_partial_match = 1;
	}
	if (!exact_match && second_partial_match) {
		/* ambiguous abbreviation */
		if (PRINT_ERROR)
			warnx(ambig,
#ifdef GNU_COMPATIBLE
			     current_dash,
#endif
			     (int)current_argv_len,
			     current_argv);
		optopt = 0;
		return (BADCH);
	}
	if (match != -1) {		/* option found */
		if (long_options[match].has_arg == no_argument
		    && has_equal) {
			if (PRINT_ERROR)
				warnx(noarg,
#ifdef GNU_COMPATIBLE
				     current_dash,
#endif
				     (int)current_argv_len,
				     current_argv);
			/*
			 * XXX: GNU sets optopt to val regardless of flag
			 */
			if (long_options[match].flag == NULL)
				optopt = long_options[match].val;
			else
				optopt = 0;
#ifdef GNU_COMPATIBLE
			return (BADCH);
#else
			return (BADARG);
#endif
		}
		if (long_options[match].has_arg == required_argument ||
		    long_options[match].has_arg == optional_argument) {
			if (has_equal)
				optarg = has_equal;
			else if (long_options[match].has_arg ==
			    required_argument) {
				/*
				 * optional argument doesn't use next nargv
				 */
				optarg = nargv[optind++];
			}
		}
		if ((long_options[match].has_arg == required_argument)
		    && (optarg == NULL)) {
			/*
			 * Missing argument; leading ':' indicates no error
			 * should be generated.
			 */
			if (PRINT_ERROR)
				warnx(recargstring,
#ifdef GNU_COMPATIBLE
				    current_dash,
#endif
				    current_argv);
			/*
			 * XXX: GNU sets optopt to val regardless of flag
			 */
			if (long_options[match].flag == NULL)
				optopt = long_options[match].val;
			else
				optopt = 0;
			--optind;
			return (BADARG);
		}
	} else {			/* unknown option */
		if (short_too) {
			--optind;
			return (-1);
		}
		if (PRINT_ERROR)
			warnx(illoptstring,
#ifdef GNU_COMPATIBLE
			      current_dash,
#endif
			      current_argv);
		optopt = 0;
		return (BADCH);
	}
	if (idx)
		*idx = match;
	if (long_options[match].flag) {
		*long_options[match].flag = long_options[match].val;
		return (0);
	} else
		return (long_options[match].val);
}